

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O1

uint32_t __thiscall
icu_63::CollationIterator::getCE32FromPrefix
          (CollationIterator *this,CollationData *d,uint32_t ce32,UErrorCode *errorCode)

{
  UChar *pUVar1;
  UChar UVar2;
  byte bVar3;
  int cp;
  UStringTrieResult UVar4;
  uint uVar5;
  uint32_t uVar6;
  UCharsTrie prefixes;
  UCharsTrie local_48;
  
  pUVar1 = d->contexts + (ce32 >> 0xd);
  local_48.uchars_ = pUVar1 + 2;
  uVar6 = CONCAT22(*pUVar1,pUVar1[1]);
  local_48.ownedArray_ = (char16_t *)0x0;
  local_48.remainingMatchLength_ = -1;
  uVar5 = 0;
  local_48.pos_ = local_48.uchars_;
  do {
    cp = (*(this->super_UObject)._vptr_UObject[7])(this,errorCode);
    if (cp < 0) {
      bVar3 = 0;
    }
    else {
      UVar4 = UCharsTrie::nextForCodePoint(&local_48,cp);
      if (1 < (int)UVar4) {
        UVar2 = *local_48.pos_;
        if (UVar2 < L'\0') {
          uVar6 = (ushort)UVar2 & 0x7fff;
          if (0x3fff < uVar6) {
            if (uVar6 == 0x7fff) goto LAB_0022a76a;
            uVar6 = uVar6 * 0x10000 + (uint)(ushort)local_48.pos_[1] + 0xc0000000;
          }
        }
        else if ((ushort)UVar2 < 0x4040) {
          uVar6 = ((ushort)UVar2 >> 6) - 1;
        }
        else if ((ushort)UVar2 < 0x7fc0) {
          uVar6 = ((ushort)UVar2 & 0x7fc0) * 0x400 + (uint)(ushort)local_48.pos_[1] + 0xfeff0000;
        }
        else {
LAB_0022a76a:
          uVar6 = CONCAT22(local_48.pos_[1],local_48.pos_[2]);
        }
      }
      uVar5 = uVar5 + 1;
      bVar3 = (byte)UVar4 & 1;
    }
    if (bVar3 == 0) {
      (*(this->super_UObject)._vptr_UObject[0xc])(this,(ulong)uVar5,errorCode);
      UCharsTrie::~UCharsTrie(&local_48);
      return uVar6;
    }
  } while( true );
}

Assistant:

uint32_t
CollationIterator::getCE32FromPrefix(const CollationData *d, uint32_t ce32,
                                     UErrorCode &errorCode) {
    const UChar *p = d->contexts + Collation::indexFromCE32(ce32);
    ce32 = CollationData::readCE32(p);  // Default if no prefix match.
    p += 2;
    // Number of code points read before the original code point.
    int32_t lookBehind = 0;
    UCharsTrie prefixes(p);
    for(;;) {
        UChar32 c = previousCodePoint(errorCode);
        if(c < 0) { break; }
        ++lookBehind;
        UStringTrieResult match = prefixes.nextForCodePoint(c);
        if(USTRINGTRIE_HAS_VALUE(match)) {
            ce32 = (uint32_t)prefixes.getValue();
        }
        if(!USTRINGTRIE_HAS_NEXT(match)) { break; }
    }
    forwardNumCodePoints(lookBehind, errorCode);
    return ce32;
}